

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O2

void rsg::assignMasked(ExecValueAccess dst,ExecConstValueAccess src,ExecConstValueAccess mask)

{
  Type TVar1;
  int compNdx;
  long lVar2;
  ulong uVar3;
  int elementNdx;
  VariableType *pVVar4;
  int elemNdx;
  int iVar5;
  ulong uVar6;
  StridedValueAccess<64> SVar7;
  ConstStridedValueAccess<64> CVar8;
  ExecConstValueAccess src_local;
  ExecValueAccess dst_local;
  
  src_local.m_value = src.m_value;
  src_local.m_type = src.m_type;
  dst_local.super_ConstStridedValueAccess<64>.m_value =
       dst.super_ConstStridedValueAccess<64>.m_value;
  pVVar4 = dst.super_ConstStridedValueAccess<64>.m_type;
  TVar1 = pVVar4->m_baseType;
  if (TVar1 < TYPE_LAST) {
    dst_local.super_ConstStridedValueAccess<64>.m_type = pVVar4;
    if ((0xceU >> (TVar1 & 0x1f) & 1) == 0) {
      if (TVar1 == TYPE_STRUCT) {
        uVar3 = ((long)(pVVar4->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pVVar4->m_members).
                      super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28;
        uVar6 = uVar3 & 0xffffffff;
        iVar5 = 0;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
          iVar5 = 0;
        }
        for (; (int)uVar6 != iVar5; iVar5 = iVar5 + 1) {
          SVar7 = StridedValueAccess<64>::member(&dst_local,iVar5);
          CVar8 = ConstStridedValueAccess<64>::member(&src_local,iVar5);
          assignMasked((ExecValueAccess)SVar7.super_ConstStridedValueAccess<64>,CVar8,mask);
        }
      }
      else if (TVar1 == TYPE_ARRAY) {
        iVar5 = pVVar4->m_numElements;
        elementNdx = 0;
        if (iVar5 < 1) {
          iVar5 = 0;
          elementNdx = 0;
        }
        for (; iVar5 != elementNdx; elementNdx = elementNdx + 1) {
          SVar7 = StridedValueAccess<64>::arrayElement(&dst_local,elementNdx);
          CVar8 = ConstStridedValueAccess<64>::arrayElement(&src_local,elementNdx);
          assignMasked((ExecValueAccess)SVar7.super_ConstStridedValueAccess<64>,CVar8,mask);
        }
      }
    }
    else {
      for (iVar5 = 0; iVar5 < pVVar4->m_numElements; iVar5 = iVar5 + 1) {
        SVar7 = StridedValueAccess<64>::component(&dst_local,iVar5);
        CVar8 = ConstStridedValueAccess<64>::component(&src_local,iVar5);
        for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
          if (mask.m_value[lVar2].boolVal == true) {
            SVar7.super_ConstStridedValueAccess<64>.m_value[lVar2] = CVar8.m_value[lVar2];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void assignMasked (ExecValueAccess dst, ExecConstValueAccess src, ExecConstValueAccess mask)
{
	const VariableType& type = dst.getType();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_ARRAY:
		{
			int numElems = type.getNumElements();
			for (int elemNdx = 0; elemNdx < numElems; elemNdx++)
				assignMasked(dst.arrayElement(elemNdx), src.arrayElement(elemNdx), mask);

			break;
		}

		case VariableType::TYPE_STRUCT:
		{
			int numMembers = (int)type.getMembers().size();
			for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
				assignMasked(dst.member(memberNdx), src.member(memberNdx), mask);

			break;
		}

		case VariableType::TYPE_FLOAT:
		case VariableType::TYPE_INT:
		case VariableType::TYPE_BOOL:
		case VariableType::TYPE_SAMPLER_2D:
		case VariableType::TYPE_SAMPLER_CUBE:
		{
			for (int elemNdx = 0; elemNdx < type.getNumElements(); elemNdx++)
			{
				ExecValueAccess			dstElem		= dst.component(elemNdx);
				ExecConstValueAccess	srcElem		= src.component(elemNdx);

				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				{
					if (mask.asBool(compNdx))
						dstElem.asScalar(compNdx) = srcElem.asScalar(compNdx);
				}
			}

			break;
		}

		default:
			DE_FATAL("Unsupported");
			break;
	}
}